

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_TimedText.cpp
# Opt level: O2

h__Reader * __thiscall
AS_02::TimedText::MXFReader::h__Reader::ReadAncillaryResource
          (h__Reader *this,UUID *uuid,FrameBuffer *frame_buf,AESDecContext *Ctx,HMACContext *HMAC)

{
  iterator iVar1;
  ILogSink *this_00;
  char *pcVar2;
  InterchangeObject *tmp_iobj;
  char buf [64];
  
  iVar1 = std::
          _Rb_tree<Kumu::UUID,_std::pair<const_Kumu::UUID,_Kumu::UUID>,_std::_Select1st<std::pair<const_Kumu::UUID,_Kumu::UUID>_>,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>_>
          ::find((_Rb_tree<Kumu::UUID,_std::pair<const_Kumu::UUID,_Kumu::UUID>,_std::_Select1st<std::pair<const_Kumu::UUID,_Kumu::UUID>_>,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>_>
                  *)&uuid[0x28].super_Identifier<16U>.m_HasValue,(key_type *)frame_buf);
  if (iVar1._M_node == (_Base_ptr)(uuid[0x28].super_Identifier<16U>.m_Value + 7)) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    pcVar2 = Kumu::UUID::EncodeHex((UUID *)frame_buf,buf,0x40);
    Kumu::ILogSink::Error(this_00,"No such resource: %s\n",pcVar2);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_RANGE);
  }
  else {
    ASDCP::MXF::OP1aHeader::GetMDObjectByID
              ((UUID *)this,(InterchangeObject **)((uuid->super_Identifier<16U>).m_Value + 0xf));
    if (-1 < *(int *)&(this->super_h__AS02Reader).
                      super_TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>.
                      _vptr_TrackFileReader) {
      __assert_fail("desc_object",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
                    ,0xd3,
                    "ASDCP::Result_t AS_02::TimedText::MXFReader::h__Reader::ReadAncillaryResource(const Kumu::UUID &, ASDCP::TimedText::FrameBuffer &, AESDecContext *, HMACContext *)"
                   );
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::TimedText::MXFReader::h__Reader::ReadAncillaryResource(const Kumu::UUID& uuid,
							      ASDCP::TimedText::FrameBuffer& frame_buf,
							      AESDecContext* Ctx, HMACContext* HMAC)
{
  ResourceMap_t::const_iterator ri = m_ResourceMap.find(uuid);
  if ( ri == m_ResourceMap.end() )
    {
      char buf[64];
      DefaultLogSink().Error("No such resource: %s\n", uuid.EncodeHex(buf, 64));
      return RESULT_RANGE;
    }

  // get the subdescriptor
  InterchangeObject* tmp_iobj = 0;
  Result_t result = m_HeaderPart.GetMDObjectByID((*ri).second, &tmp_iobj);
  TimedTextResourceSubDescriptor* desc_object = dynamic_cast<TimedTextResourceSubDescriptor*>(tmp_iobj);

  if ( KM_SUCCESS(result) )
    {
      assert(desc_object);
      result = ReadGenericStreamPartitionPayload(desc_object->EssenceStreamID, frame_buf, Ctx, HMAC);
    }

  if ( KM_SUCCESS(result) )
    {
      frame_buf.AssetID(uuid.Value());
      frame_buf.MIMEType(desc_object->MIMEMediaType);
    }
  
  return result;
}